

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O0

void test_open_address_hashmap_compute_simple_hash(planck_unit_test_t *tc)

{
  char *state;
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_hash_t iVar3;
  int iVar4;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  ion_hashmap_t map;
  planck_unit_test_t *tc_local;
  
  map.entry = &tc->result;
  initialize_hash_map_std_conditions((ion_hashmap_t *)local_48);
  local_4c = 0;
  while( true ) {
    state = map.entry;
    if (99 < local_4c) {
      iVar2 = oah_destroy((ion_hashmap_t *)local_48);
      pVar1 = planck_unit_assert_true
                        ((planck_unit_test_t *)state,(uint)(iVar2 == '\0'),0x90,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      return;
    }
    iVar4 = local_4c % (int)map.super.id;
    iVar3 = oah_compute_simple_hash((ion_hashmap_t *)local_48,&local_4c,4);
    pVar1 = planck_unit_assert_true
                      ((planck_unit_test_t *)state,(uint)(iVar4 == iVar3),0x8d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    local_4c = local_4c + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_compute_simple_hash(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;		/* create handler for hashmap */
	int				i;

	initialize_hash_map_std_conditions(&map);

	for (i = 0; i < ION_MAX_HASH_TEST; i++) {
		PLANCK_UNIT_ASSERT_TRUE(tc, (i % map.map_size) == oah_compute_simple_hash(&map, ((int *) &i), sizeof(i)));
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}